

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O2

void convert_samples_short
               (int buf_c,short **buffer,int b_offset,int data_c,float **data,int d_offset,
               int samples)

{
  uint uVar1;
  float *pfVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  short *psVar15;
  ulong uVar16;
  float fVar17;
  float local_b8 [34];
  
  lVar4 = (long)b_offset;
  if (((data_c < 7) && (buf_c < 3)) && (buf_c != data_c)) {
    uVar5 = (ulong)(uint)data_c;
    if (data_c < 1) {
      uVar5 = 0;
    }
    uVar8 = (ulong)(uint)buf_c;
    if (buf_c < 1) {
      uVar8 = 0;
    }
    for (uVar7 = 0; uVar7 != uVar8; uVar7 = uVar7 + 1) {
      uVar1 = convert_samples_short::channel_selector[(uint)buf_c][uVar7];
      psVar15 = buffer[uVar7] + lVar4;
      iVar12 = 0;
      lVar10 = 0;
      lVar9 = (long)d_offset << 2;
      iVar13 = 0x20;
      while( true ) {
        if (samples <= lVar10) break;
        local_b8[0x1c] = 0.0;
        local_b8[0x1d] = 0.0;
        local_b8[0x1e] = 0.0;
        local_b8[0x1f] = 0.0;
        local_b8[0x18] = 0.0;
        local_b8[0x19] = 0.0;
        local_b8[0x1a] = 0.0;
        local_b8[0x1b] = 0.0;
        local_b8[0x14] = 0.0;
        local_b8[0x15] = 0.0;
        local_b8[0x16] = 0.0;
        local_b8[0x17] = 0.0;
        local_b8[0x10] = 0.0;
        local_b8[0x11] = 0.0;
        local_b8[0x12] = 0.0;
        local_b8[0x13] = 0.0;
        local_b8[0xc] = 0.0;
        local_b8[0xd] = 0.0;
        local_b8[0xe] = 0.0;
        local_b8[0xf] = 0.0;
        local_b8[8] = 0.0;
        local_b8[9] = 0.0;
        local_b8[10] = 0.0;
        local_b8[0xb] = 0.0;
        local_b8[4] = 0.0;
        local_b8[5] = 0.0;
        local_b8[6] = 0.0;
        local_b8[7] = 0.0;
        local_b8[0] = 0.0;
        local_b8[1] = 0.0;
        local_b8[2] = 0.0;
        local_b8[3] = 0.0;
        iVar11 = (int)lVar10;
        iVar3 = samples - iVar11;
        if (iVar13 + iVar11 <= samples) {
          iVar3 = iVar13;
        }
        iVar13 = iVar13 + iVar11;
        iVar11 = iVar13;
        if (samples < iVar13) {
          iVar11 = samples;
        }
        uVar14 = (ulong)(uint)(iVar11 + iVar12);
        if (iVar11 + iVar12 < 1) {
          uVar14 = 0;
        }
        for (uVar16 = 0; uVar16 != uVar5; uVar16 = uVar16 + 1) {
          if ((uVar1 & (int)channel_position[data_c][uVar16]) != 0) {
            for (uVar6 = 0; uVar14 != uVar6; uVar6 = uVar6 + 1) {
              local_b8[uVar6] = *(float *)((long)data[uVar16] + uVar6 * 4 + lVar9) + local_b8[uVar6]
              ;
            }
          }
        }
        if (samples < iVar13) {
          iVar13 = samples;
        }
        uVar14 = (ulong)(uint)(iVar13 + iVar12);
        if (iVar13 + iVar12 < 1) {
          uVar14 = 0;
        }
        for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
          fVar17 = local_b8[uVar16] + 384.0;
          if ((int)fVar17 < 0x43bf8001) {
            fVar17 = 383.0;
          }
          if (0x43c07ffe < (int)fVar17) {
            fVar17 = 384.99997;
          }
          psVar15[uVar16] = SUB42(fVar17,0);
        }
        lVar10 = lVar10 + 0x20;
        iVar12 = iVar12 + -0x20;
        lVar9 = lVar9 + 0x80;
        psVar15 = psVar15 + 0x20;
        iVar13 = iVar3;
      }
    }
  }
  else {
    if (buf_c < data_c) {
      data_c = buf_c;
    }
    uVar5 = 0;
    uVar8 = 0;
    if (0 < samples) {
      uVar8 = (ulong)(uint)samples;
    }
    uVar7 = (ulong)(uint)data_c;
    if (data_c < 1) {
      uVar7 = uVar5;
    }
    for (; uVar5 != uVar7; uVar5 = uVar5 + 1) {
      psVar15 = buffer[uVar5];
      pfVar2 = data[uVar5];
      for (uVar14 = 0; uVar8 != uVar14; uVar14 = uVar14 + 1) {
        fVar17 = pfVar2[(long)d_offset + uVar14] + 384.0;
        if ((int)fVar17 < 0x43bf8001) {
          fVar17 = 383.0;
        }
        if (0x43c07ffe < (int)fVar17) {
          fVar17 = 384.99997;
        }
        psVar15[lVar4 + uVar14] = SUB42(fVar17,0);
      }
    }
    for (; (long)uVar7 < (long)buf_c; uVar7 = uVar7 + 1) {
      memset(buffer[uVar7] + lVar4,0,(long)samples * 2);
    }
  }
  return;
}

Assistant:

static void convert_samples_short(int buf_c, short **buffer, int b_offset, int data_c, float **data, int d_offset, int samples)
{
   int i;
   if (buf_c != data_c && buf_c <= 2 && data_c <= 6) {
      static int channel_selector[3][2] = { {0}, {PLAYBACK_MONO}, {PLAYBACK_LEFT, PLAYBACK_RIGHT} };
      for (i=0; i < buf_c; ++i)
         compute_samples(channel_selector[buf_c][i], buffer[i]+b_offset, data_c, data, d_offset, samples);
   } else {
      int limit = buf_c < data_c ? buf_c : data_c;
      for (i=0; i < limit; ++i)
         copy_samples(buffer[i]+b_offset, data[i]+d_offset, samples);
      for (   ; i < buf_c; ++i)
         memset(buffer[i]+b_offset, 0, sizeof(short) * samples);
   }
}